

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O2

void __thiscall clickhouse::ZeroCopyOutput::DoWrite(ZeroCopyOutput *this,void *data,size_t len)

{
  int iVar1;
  undefined4 extraout_var;
  void *ptr;
  void *local_30;
  size_t __n;
  
  while( true ) {
    if (len == 0) {
      return;
    }
    iVar1 = (*(this->super_OutputStream)._vptr_OutputStream[4])(this,&local_30,len);
    __n = CONCAT44(extraout_var,iVar1);
    if (__n == 0) break;
    memcpy(local_30,data,__n);
    len = len - __n;
    data = (void *)((long)data + __n);
  }
  return;
}

Assistant:

void ZeroCopyOutput::DoWrite(const void* data, size_t len) {
    while (len > 0) {
        void* ptr;
        size_t result = DoNext(&ptr, len);

        if (result) {
            memcpy(ptr, data, result);
            len -= result;
            data = static_cast<const uint8_t*>(data) + result;
        } else {
            break;
        }
    }
}